

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAtomicRMWSetPtr(BinaryenExpressionRef expr,BinaryenExpressionRef ptrExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef ptrExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::AtomicRMW>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<AtomicRMW>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xba5,
                  "void BinaryenAtomicRMWSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (ptrExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = ptrExpr;
    return;
  }
  __assert_fail("ptrExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xba6,"void BinaryenAtomicRMWSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenAtomicRMWSetPtr(BinaryenExpressionRef expr,
                             BinaryenExpressionRef ptrExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicRMW>());
  assert(ptrExpr);
  static_cast<AtomicRMW*>(expression)->ptr = (Expression*)ptrExpr;
}